

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem.cpp
# Opt level: O1

int __thiscall Problem::getStateConflicts(Problem *this,vector<int,_std::allocator<int>_> *bidNos)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  vector<node,_std::allocator<node>_> *pvVar4;
  pointer pnVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  vector<int,_std::allocator<int>_> conflictArray;
  allocator_type local_35;
  value_type_conflict local_34;
  vector<int,_std::allocator<int>_> local_30;
  
  local_34 = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_30,(long)this->numRegions,&local_34,&local_35);
  if (this->numCompanies < 1) {
    iVar7 = 0;
  }
  else {
    piVar3 = (bidNos->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    pvVar4 = this->problemData;
    lVar6 = 0;
    iVar7 = 0;
    do {
      iVar1 = piVar3[lVar6];
      pnVar5 = pvVar4[lVar6].super__Vector_base<node,_std::allocator<node>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar8 = (long)pnVar5[iVar1].norc;
      if (0 < lVar8) {
        lVar9 = 0;
        do {
          iVar2 = pnVar5[iVar1].region[lVar9];
          if (local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[iVar2] == 0) {
            local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar2] = 1;
          }
          else {
            iVar7 = iVar7 + 1;
          }
          lVar9 = lVar9 + 1;
        } while (lVar8 != lVar9);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < this->numCompanies);
  }
  if (local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return iVar7;
}

Assistant:

int Problem::getStateConflicts(vector<int> bidNos) {
    vector<int> conflictArray(this->numRegions, 0);
    int totalConflicts = 0;
    for (int i = 0; i < this->numCompanies; i++) {
        int curBidNumber = bidNos[i];
        // cout<<"Current bid no.: "<<curBidNumber<<endl;
        int *curRegions = this->problemData[i][curBidNumber].region;
        int curRegionsSize = this->problemData[i][curBidNumber].norc;
        // cout<<"Region size: "<<curRegionsSize<<endl;
        for (int j = 0; j < curRegionsSize; j++) {
            if (conflictArray[curRegions[j]] != 0) {
                totalConflicts++;
            }
            else {
                conflictArray[curRegions[j]] = 1;
            }
        }
    }
    // cout<<"Conflicts found: "<<totalConflicts<<endl;
    return totalConflicts;
}